

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  void *user_data_local;
  ImGuiErrorLogCallback log_callback_local;
  
  pIVar2 = GImGui;
  while( true ) {
    if ((pIVar2->CurrentWindowStack).Size < 1) {
      return;
    }
    ErrorCheckEndWindowRecover(log_callback,user_data);
    pIVar1 = pIVar2->CurrentWindow;
    if ((pIVar2->CurrentWindowStack).Size == 1) break;
    if ((pIVar1->Flags & 0x1000000U) == 0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing End() for \'%s\'",pIVar1->Name);
      }
      End();
    }
    else {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndChild() for \'%s\'",pIVar1->Name);
      }
      EndChild();
    }
  }
  if ((pIVar1->IsFallbackWindow & 1U) != 0) {
    return;
  }
  __assert_fail("window->IsFallbackWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x1fb9,"void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback, void *)");
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0) //-V1044
    {
        ErrorCheckEndWindowRecover(log_callback, user_data);
        ImGuiWindow* window = g.CurrentWindow;
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(window->IsFallbackWindow);
            break;
        }
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}